

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FenceVkImpl.cpp
# Opt level: O2

void __thiscall
Diligent::FenceVkImpl::AddPendingSyncPoint
          (FenceVkImpl *this,SoftwareQueueIndex CommandQueueId,Uint64 Value,
          SyncPointVkPtr *SyncPoint)

{
  _Elt_pointer pSVar1;
  _Elt_pointer pSVar2;
  size_type sVar3;
  _Elt_pointer pSVar4;
  string msg;
  Uint64 LastValue;
  undefined7 in_stack_ffffffffffffffa8;
  string local_50;
  pointer local_30;
  pointer local_28;
  
  local_30 = (pointer)Value;
  if ((this->m_TimelineSemaphore).m_VkObject == (VkSemaphore_T *)0x0) {
    if ((SyncPoint->super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
        (element_type *)0x0) {
      FenceBase<Diligent::EngineVkImplTraits>::DvpSignal
                (&this->super_FenceBase<Diligent::EngineVkImplTraits>,Value);
      std::mutex::lock(&this->m_SyncPointsGuard);
      pSVar2 = (this->m_SyncPoints).
               super__Deque_base<Diligent::FenceVkImpl::SyncPointData,_std::allocator<Diligent::FenceVkImpl::SyncPointData>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pSVar2 == (this->m_SyncPoints).
                    super__Deque_base<Diligent::FenceVkImpl::SyncPointData,_std::allocator<Diligent::FenceVkImpl::SyncPointData>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur) {
        local_28 = (pointer)(this->super_FenceBase<Diligent::EngineVkImplTraits>).
                            m_LastCompletedFenceValue.super___atomic_base<unsigned_long>._M_i;
        Value = (Uint64)local_30;
      }
      else {
        if (pSVar2 == (this->m_SyncPoints).
                      super__Deque_base<Diligent::FenceVkImpl::SyncPointData,_std::allocator<Diligent::FenceVkImpl::SyncPointData>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_first) {
          pSVar2 = (this->m_SyncPoints).
                   super__Deque_base<Diligent::FenceVkImpl::SyncPointData,_std::allocator<Diligent::FenceVkImpl::SyncPointData>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
        }
        local_28 = (pointer)pSVar2[-1].Value;
      }
      if (Value <= local_28) {
        FormatString<char[12],unsigned_long,char[40],unsigned_long,char[2]>
                  (&local_50,(Diligent *)"New value (",(char (*) [12])&local_30,
                   (unsigned_long *)") must be greater than previous value (",
                   (char (*) [40])&local_28,(unsigned_long *)0x801c00,
                   (char (*) [2])CONCAT17(CommandQueueId.m_Value,in_stack_ffffffffffffffa8));
        DebugAssertionFailed
                  (local_50._M_dataplus._M_p,"AddPendingSyncPoint",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/FenceVkImpl.cpp"
                   ,0x127);
        std::__cxx11::string::~string((string *)&local_50);
      }
      pSVar2 = (this->m_SyncPoints).
               super__Deque_base<Diligent::FenceVkImpl::SyncPointData,_std::allocator<Diligent::FenceVkImpl::SyncPointData>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pSVar2 != (this->m_SyncPoints).
                    super__Deque_base<Diligent::FenceVkImpl::SyncPointData,_std::allocator<Diligent::FenceVkImpl::SyncPointData>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur) {
        pSVar1 = (this->m_SyncPoints).
                 super__Deque_base<Diligent::FenceVkImpl::SyncPointData,_std::allocator<Diligent::FenceVkImpl::SyncPointData>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_first;
        pSVar4 = pSVar2;
        if (pSVar2 == pSVar1) {
          pSVar4 = (this->m_SyncPoints).
                   super__Deque_base<Diligent::FenceVkImpl::SyncPointData,_std::allocator<Diligent::FenceVkImpl::SyncPointData>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
        }
        if (((pSVar4[-1].SyncPoint.
              super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            m_CommandQueueId).m_Value != CommandQueueId.m_Value) {
          if (pSVar2 == pSVar1) {
            pSVar2 = (this->m_SyncPoints).
                     super__Deque_base<Diligent::FenceVkImpl::SyncPointData,_std::allocator<Diligent::FenceVkImpl::SyncPointData>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
          }
          local_28 = (pointer)CONCAT71(local_28._1_7_,
                                       ((pSVar2[-1].SyncPoint.
                                         super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr)->m_CommandQueueId).m_Value);
          FormatString<char[54],Diligent::IndexWrapper<unsigned_char,Diligent::_SoftwareQueueIndexTag>,char[54],Diligent::IndexWrapper<unsigned_char,Diligent::_SoftwareQueueIndexTag>,char[117]>
                    (&local_50,(Diligent *)"Fence enqueued for signal operation in command queue ",
                     (char (*) [54])&stack0xffffffffffffffaf,
                     (IndexWrapper<unsigned_char,_Diligent::_SoftwareQueueIndexTag> *)
                     ", but previous signal operation was in command queue ",
                     (char (*) [54])&local_28,
                     (IndexWrapper<unsigned_char,_Diligent::_SoftwareQueueIndexTag> *)
                     ". This may cause data race or deadlock. Call Wait() to ensure that all pending signal operation have been completed."
                     ,(char (*) [117])CONCAT17(CommandQueueId.m_Value,in_stack_ffffffffffffffa8));
          DebugAssertionFailed
                    (local_50._M_dataplus._M_p,"AddPendingSyncPoint",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/FenceVkImpl.cpp"
                     ,0x12e);
          std::__cxx11::string::~string((string *)&local_50);
        }
      }
      sVar3 = std::
              deque<Diligent::FenceVkImpl::SyncPointData,_std::allocator<Diligent::FenceVkImpl::SyncPointData>_>
              ::size(&this->m_SyncPoints);
      if (8 < sVar3) {
        InternalGetCompletedValue(this);
      }
      local_50._M_dataplus._M_p = local_30;
      local_50._M_string_length =
           (size_type)
           (SyncPoint->super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
      ;
      local_50.field_2._M_allocated_capacity =
           (size_type)
           (SyncPoint->super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
      (SyncPoint->super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
      ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (SyncPoint->super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
           (element_type *)0x0;
      std::
      deque<Diligent::FenceVkImpl::SyncPointData,_std::allocator<Diligent::FenceVkImpl::SyncPointData>_>
      ::emplace_back<Diligent::FenceVkImpl::SyncPointData>
                (&this->m_SyncPoints,(SyncPointData *)&local_50);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &local_50.field_2._M_allocated_capacity);
      pthread_mutex_unlock((pthread_mutex_t *)&this->m_SyncPointsGuard);
      return;
    }
    FormatString<char[18]>(&local_50,(char (*) [18])"SyncPoint is null");
    DebugAssertionFailed
              (local_50._M_dataplus._M_p,"AddPendingSyncPoint",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/FenceVkImpl.cpp"
               ,0x11b);
  }
  else {
    FormatString<char[46]>(&local_50,(char (*) [46])"Not supported when timeline semaphore is used")
    ;
    DebugAssertionFailed
              (local_50._M_dataplus._M_p,"AddPendingSyncPoint",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/FenceVkImpl.cpp"
               ,0x116);
  }
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void FenceVkImpl::AddPendingSyncPoint(SoftwareQueueIndex CommandQueueId, Uint64 Value, SyncPointVkPtr SyncPoint)
{
    if (IsTimelineSemaphore())
    {
        DEV_ERROR("Not supported when timeline semaphore is used");
        return;
    }
    if (SyncPoint == nullptr)
    {
        UNEXPECTED("SyncPoint is null");
        return;
    }

    DvpSignal(Value);

    std::lock_guard<std::mutex> Lock{m_SyncPointsGuard};

#ifdef DILIGENT_DEVELOPMENT
    {
        const Uint64 LastValue = m_SyncPoints.empty() ? m_LastCompletedFenceValue.load() : m_SyncPoints.back().Value;
        DEV_CHECK_ERR(Value > LastValue,
                      "New value (", Value, ") must be greater than previous value (", LastValue, ")");
    }
    if (!m_SyncPoints.empty())
    {
        DEV_CHECK_ERR(m_SyncPoints.back().SyncPoint->GetCommandQueueId() == CommandQueueId,
                      "Fence enqueued for signal operation in command queue ", CommandQueueId,
                      ", but previous signal operation was in command queue ", m_SyncPoints.back().SyncPoint->GetCommandQueueId(),
                      ". This may cause data race or deadlock. Call Wait() to ensure that all pending signal operation have been completed.");
    }
#endif

    // If IFence is used only for synchronization between queues it will accumulate many more sync points.
    // We need to check VkFence and remove already reached sync points.
    if (m_SyncPoints.size() > RequiredArraySize)
    {
        InternalGetCompletedValue();
    }

    m_SyncPoints.push_back({Value, std::move(SyncPoint)});
}